

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::CompilerGLSL::remap_ext_framebuffer_fetch
          (CompilerGLSL *this,uint32_t input_attachment_index,uint32_t color_location,bool coherent)

{
  pair<unsigned_int,_bool> local_28;
  
  local_28.first = input_attachment_index;
  local_28._4_4_ = color_location;
  ::std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&this->subpass_to_framebuffer_fetch_attachment,
             (pair<unsigned_int,_unsigned_int> *)&local_28);
  local_28.second = coherent;
  local_28.first = color_location;
  ::std::vector<std::pair<unsigned_int,bool>,std::allocator<std::pair<unsigned_int,bool>>>::
  emplace_back<std::pair<unsigned_int,bool>>
            ((vector<std::pair<unsigned_int,bool>,std::allocator<std::pair<unsigned_int,bool>>> *)
             &this->inout_color_attachments,&local_28);
  return;
}

Assistant:

void CompilerGLSL::remap_ext_framebuffer_fetch(uint32_t input_attachment_index, uint32_t color_location, bool coherent)
{
	subpass_to_framebuffer_fetch_attachment.push_back({ input_attachment_index, color_location });
	inout_color_attachments.push_back({ color_location, coherent });
}